

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

NewClassExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NewClassExpressionSyntax,slang::syntax::NameSyntax&,slang::syntax::ArgumentListSyntax*&>
          (BumpAllocator *this,NameSyntax *args,ArgumentListSyntax **args_1)

{
  NewClassExpressionSyntax *this_00;
  
  this_00 = (NewClassExpressionSyntax *)allocate(this,0x20,8);
  slang::syntax::NewClassExpressionSyntax::NewClassExpressionSyntax(this_00,args,*args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }